

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::TextureSRGBDecodeCase::test
          (TextureSRGBDecodeCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TesterType tester;
  TestLog *pTVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  GLenum GVar7;
  undefined4 extraout_var;
  ObjectTraits *traits;
  long *plVar8;
  size_type *psVar9;
  ulong uVar10;
  undefined8 uVar11;
  ScopedLogSection section;
  GLint decodeInt;
  ScopedLogSection section_1;
  GLfloat decodeFloat;
  Texture texture;
  ScopedLogSection local_118;
  long local_110;
  TestLog local_108;
  long lStack_100;
  string local_f8;
  ulong *local_d8;
  long local_d0;
  ulong local_c8 [2];
  string local_b8;
  string local_98;
  ResultCollector *local_78;
  GLuint local_6c;
  ScopedLogSection local_68;
  code *local_60;
  GLenum local_58;
  GLfloat local_4c;
  ObjectWrapper local_48;
  
  tester = (this->super_TextureTest).m_tester;
  local_78 = result;
  bVar4 = isPureIntTester(tester);
  bVar5 = true;
  if (!bVar4) {
    bVar5 = isPureUintTester(tester);
  }
  iVar6 = (*((this->super_TextureTest).m_renderCtx)->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper(&local_48,(Functions *)CONCAT44(extraout_var,iVar6),traits);
  glu::CallLogWrapper::glBindTexture(gl,(this->super_TextureTest).m_target,local_48.m_object);
  GVar7 = glu::CallLogWrapper::glGetError(gl);
  if (GVar7 != 0) {
    local_d8 = local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Got Error ","");
    local_60 = glu::getErrorName;
    local_58 = GVar7;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_f8,&local_60);
    uVar10 = 0xf;
    if (local_d8 != local_c8) {
      uVar10 = local_c8[0];
    }
    if (uVar10 < local_f8._M_string_length + local_d0) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        uVar11 = local_f8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_f8._M_string_length + local_d0) goto LAB_00941fd8;
      plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_d8)
      ;
    }
    else {
LAB_00941fd8:
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_d8,(ulong)local_f8._M_dataplus._M_p);
    }
    local_118.m_log = &local_108;
    pTVar3 = (TestLog *)(plVar8 + 2);
    if ((TestLog *)*plVar8 == pTVar3) {
      local_108.m_log = pTVar3->m_log;
      lStack_100 = plVar8[3];
    }
    else {
      local_108.m_log = pTVar3->m_log;
      local_118.m_log = (TestLog *)*plVar8;
    }
    local_110 = plVar8[1];
    *plVar8 = (long)pTVar3;
    plVar8[1] = 0;
    *(undefined1 *)&pTVar3->m_log = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_b8.field_2._M_allocated_capacity = *psVar9;
      local_b8.field_2._8_8_ = plVar8[3];
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *psVar9;
      local_b8._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_b8._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_b8);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_98.field_2._M_allocated_capacity = *psVar9;
      local_98.field_2._8_8_ = plVar8[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar9;
      local_98._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_98._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::ResultCollector::fail(local_78,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (local_118.m_log != &local_108) {
      operator_delete(local_118.m_log,(ulong)((long)&(local_108.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_d8 != local_c8) {
      operator_delete(local_d8,local_c8[0] + 1);
    }
  }
  if (bVar5 == false) {
    pTVar3 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
    paVar2 = &local_98.field_2;
    local_98._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Initial","");
    paVar1 = &local_b8.field_2;
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Initial","");
    tcu::ScopedLogSection::ScopedLogSection(&local_118,pTVar3,&local_98,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (local_78,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               0x8a49,(this->super_TextureTest).m_type);
    tcu::TestLog::endSection(local_118.m_log);
    pTVar3 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_98._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Toggle","");
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Toggle","");
    tcu::ScopedLogSection::ScopedLogSection(&local_68,pTVar3,&local_98,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    local_6c = 0x8a49;
    local_4c = 35401.0;
    glu::CallLogWrapper::glTexParameteri
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a4a);
    GVar7 = glu::CallLogWrapper::glGetError(gl);
    if (GVar7 != 0) {
      local_d8 = local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Got Error ","");
      local_60 = glu::getErrorName;
      local_58 = GVar7;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_f8,&local_60);
      uVar10 = 0xf;
      if (local_d8 != local_c8) {
        uVar10 = local_c8[0];
      }
      if (uVar10 < local_f8._M_string_length + local_d0) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          uVar11 = local_f8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_f8._M_string_length + local_d0) goto LAB_009423b5;
        plVar8 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_f8,0,(char *)0x0,(ulong)local_d8);
      }
      else {
LAB_009423b5:
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_d8,(ulong)local_f8._M_dataplus._M_p);
      }
      local_118.m_log = &local_108;
      pTVar3 = (TestLog *)(plVar8 + 2);
      if ((TestLog *)*plVar8 == pTVar3) {
        local_108.m_log = pTVar3->m_log;
        lStack_100 = plVar8[3];
      }
      else {
        local_108.m_log = pTVar3->m_log;
        local_118.m_log = (TestLog *)*plVar8;
      }
      local_110 = plVar8[1];
      *plVar8 = (long)pTVar3;
      plVar8[1] = 0;
      *(undefined1 *)&pTVar3->m_log = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
      psVar9 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_b8.field_2._M_allocated_capacity = *psVar9;
        local_b8.field_2._8_8_ = plVar8[3];
        local_b8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_b8.field_2._M_allocated_capacity = *psVar9;
        local_b8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_b8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_b8);
      psVar9 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_98.field_2._M_allocated_capacity = *psVar9;
        local_98.field_2._8_8_ = plVar8[3];
        local_98._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar9;
        local_98._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_98._M_string_length = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      tcu::ResultCollector::fail(local_78,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if (local_118.m_log != &local_108) {
        operator_delete(local_118.m_log,(ulong)((long)&(local_108.m_log)->flags + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (local_d8 != local_c8) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (local_78,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               0x8a4a,(this->super_TextureTest).m_type);
    glu::CallLogWrapper::glTexParameteriv
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               (GLint *)&local_6c);
    GVar7 = glu::CallLogWrapper::glGetError(gl);
    if (GVar7 != 0) {
      local_d8 = local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Got Error ","");
      local_60 = glu::getErrorName;
      local_58 = GVar7;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_f8,&local_60);
      uVar10 = 0xf;
      if (local_d8 != local_c8) {
        uVar10 = local_c8[0];
      }
      if (uVar10 < local_f8._M_string_length + local_d0) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          uVar11 = local_f8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_f8._M_string_length + local_d0) goto LAB_0094262d;
        plVar8 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_f8,0,(char *)0x0,(ulong)local_d8);
      }
      else {
LAB_0094262d:
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_d8,(ulong)local_f8._M_dataplus._M_p);
      }
      local_118.m_log = &local_108;
      pTVar3 = (TestLog *)(plVar8 + 2);
      if ((TestLog *)*plVar8 == pTVar3) {
        local_108.m_log = pTVar3->m_log;
        lStack_100 = plVar8[3];
      }
      else {
        local_108.m_log = pTVar3->m_log;
        local_118.m_log = (TestLog *)*plVar8;
      }
      local_110 = plVar8[1];
      *plVar8 = (long)pTVar3;
      plVar8[1] = 0;
      *(undefined1 *)&pTVar3->m_log = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
      psVar9 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_b8.field_2._M_allocated_capacity = *psVar9;
        local_b8.field_2._8_8_ = plVar8[3];
        local_b8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_b8.field_2._M_allocated_capacity = *psVar9;
        local_b8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_b8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_b8);
      psVar9 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_98.field_2._M_allocated_capacity = *psVar9;
        local_98.field_2._8_8_ = plVar8[3];
        local_98._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar9;
        local_98._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_98._M_string_length = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      tcu::ResultCollector::fail(local_78,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if (local_118.m_log != &local_108) {
        operator_delete(local_118.m_log,(ulong)((long)&(local_108.m_log)->flags + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (local_d8 != local_c8) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (local_78,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               0x8a49,(this->super_TextureTest).m_type);
    glu::CallLogWrapper::glTexParameterf
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,35402.0);
    GVar7 = glu::CallLogWrapper::glGetError(gl);
    if (GVar7 != 0) {
      local_d8 = local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Got Error ","");
      local_60 = glu::getErrorName;
      local_58 = GVar7;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_f8,&local_60);
      uVar10 = 0xf;
      if (local_d8 != local_c8) {
        uVar10 = local_c8[0];
      }
      if (uVar10 < local_f8._M_string_length + local_d0) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          uVar11 = local_f8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_f8._M_string_length + local_d0) goto LAB_009428a5;
        plVar8 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_f8,0,(char *)0x0,(ulong)local_d8);
      }
      else {
LAB_009428a5:
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_d8,(ulong)local_f8._M_dataplus._M_p);
      }
      local_118.m_log = &local_108;
      pTVar3 = (TestLog *)(plVar8 + 2);
      if ((TestLog *)*plVar8 == pTVar3) {
        local_108.m_log = pTVar3->m_log;
        lStack_100 = plVar8[3];
      }
      else {
        local_108.m_log = pTVar3->m_log;
        local_118.m_log = (TestLog *)*plVar8;
      }
      local_110 = plVar8[1];
      *plVar8 = (long)pTVar3;
      plVar8[1] = 0;
      *(undefined1 *)&pTVar3->m_log = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
      psVar9 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_b8.field_2._M_allocated_capacity = *psVar9;
        local_b8.field_2._8_8_ = plVar8[3];
        local_b8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_b8.field_2._M_allocated_capacity = *psVar9;
        local_b8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_b8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_b8);
      psVar9 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_98.field_2._M_allocated_capacity = *psVar9;
        local_98.field_2._8_8_ = plVar8[3];
        local_98._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar9;
        local_98._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_98._M_string_length = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      tcu::ResultCollector::fail(local_78,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if (local_118.m_log != &local_108) {
        operator_delete(local_118.m_log,(ulong)((long)&(local_108.m_log)->flags + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (local_d8 != local_c8) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (local_78,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               0x8a4a,(this->super_TextureTest).m_type);
    glu::CallLogWrapper::glTexParameterfv
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,&local_4c);
    GVar7 = glu::CallLogWrapper::glGetError(gl);
    if (GVar7 != 0) {
      local_d8 = local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Got Error ","");
      local_60 = glu::getErrorName;
      local_58 = GVar7;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_f8,&local_60);
      uVar10 = 0xf;
      if (local_d8 != local_c8) {
        uVar10 = local_c8[0];
      }
      if (uVar10 < local_f8._M_string_length + local_d0) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          uVar11 = local_f8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_f8._M_string_length + local_d0) goto LAB_00942b1d;
        plVar8 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_f8,0,(char *)0x0,(ulong)local_d8);
      }
      else {
LAB_00942b1d:
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_d8,(ulong)local_f8._M_dataplus._M_p);
      }
      local_118.m_log = &local_108;
      pTVar3 = (TestLog *)(plVar8 + 2);
      if ((TestLog *)*plVar8 == pTVar3) {
        local_108.m_log = pTVar3->m_log;
        lStack_100 = plVar8[3];
      }
      else {
        local_108.m_log = pTVar3->m_log;
        local_118.m_log = (TestLog *)*plVar8;
      }
      local_110 = plVar8[1];
      *plVar8 = (long)pTVar3;
      plVar8[1] = 0;
      *(undefined1 *)&pTVar3->m_log = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
      psVar9 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_b8.field_2._M_allocated_capacity = *psVar9;
        local_b8.field_2._8_8_ = plVar8[3];
        local_b8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_b8.field_2._M_allocated_capacity = *psVar9;
        local_b8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_b8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_b8);
      psVar9 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_98.field_2._M_allocated_capacity = *psVar9;
        local_98.field_2._8_8_ = plVar8[3];
        local_98._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar9;
        local_98._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_98._M_string_length = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      tcu::ResultCollector::fail(local_78,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if (local_118.m_log != &local_108) {
        operator_delete(local_118.m_log,(ulong)((long)&(local_108.m_log)->flags + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (local_d8 != local_c8) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (local_78,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               0x8a49,(this->super_TextureTest).m_type);
    tcu::TestLog::endSection((TestLog *)CONCAT44(local_68.m_log._4_4_,local_68.m_log._0_4_));
  }
  bVar4 = isPureIntTester((this->super_TextureTest).m_tester);
  if (bVar4) {
    local_68.m_log._0_4_ = 0x8a4a;
    local_6c = 0x8a49;
    glu::CallLogWrapper::glTexParameterIiv
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               (GLint *)&local_68);
    GVar7 = glu::CallLogWrapper::glGetError(gl);
    if (GVar7 != 0) {
      local_d8 = local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Got Error ","");
      local_60 = glu::getErrorName;
      local_58 = GVar7;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_f8,&local_60);
      uVar10 = 0xf;
      if (local_d8 != local_c8) {
        uVar10 = local_c8[0];
      }
      if (uVar10 < local_f8._M_string_length + local_d0) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          uVar11 = local_f8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_f8._M_string_length + local_d0) goto LAB_00942dc7;
        plVar8 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_f8,0,(char *)0x0,(ulong)local_d8);
      }
      else {
LAB_00942dc7:
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_d8,(ulong)local_f8._M_dataplus._M_p);
      }
      local_118.m_log = &local_108;
      pTVar3 = (TestLog *)(plVar8 + 2);
      if ((TestLog *)*plVar8 == pTVar3) {
        local_108.m_log = pTVar3->m_log;
        lStack_100 = plVar8[3];
      }
      else {
        local_108.m_log = pTVar3->m_log;
        local_118.m_log = (TestLog *)*plVar8;
      }
      local_110 = plVar8[1];
      *plVar8 = (long)pTVar3;
      plVar8[1] = 0;
      *(undefined1 *)&pTVar3->m_log = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
      psVar9 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_b8.field_2._M_allocated_capacity = *psVar9;
        local_b8.field_2._8_8_ = plVar8[3];
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      }
      else {
        local_b8.field_2._M_allocated_capacity = *psVar9;
        local_b8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_b8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_b8);
      psVar9 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_98.field_2._M_allocated_capacity = *psVar9;
        local_98.field_2._8_8_ = plVar8[3];
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar9;
        local_98._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_98._M_string_length = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      tcu::ResultCollector::fail(local_78,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if (local_118.m_log != &local_108) {
        operator_delete(local_118.m_log,(ulong)((long)&(local_108.m_log)->flags + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (local_d8 != local_c8) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (local_78,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               0x8a4a,(this->super_TextureTest).m_type);
    glu::CallLogWrapper::glTexParameterIiv
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               (GLint *)&local_6c);
    GVar7 = glu::CallLogWrapper::glGetError(gl);
    if (GVar7 != 0) {
      local_d8 = local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Got Error ","");
      local_60 = glu::getErrorName;
      local_58 = GVar7;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_f8,&local_60);
      uVar10 = 0xf;
      if (local_d8 != local_c8) {
        uVar10 = local_c8[0];
      }
      if (uVar10 < local_f8._M_string_length + local_d0) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          uVar11 = local_f8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_f8._M_string_length + local_d0) goto LAB_00943047;
        plVar8 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_f8,0,(char *)0x0,(ulong)local_d8);
      }
      else {
LAB_00943047:
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_d8,(ulong)local_f8._M_dataplus._M_p);
      }
      local_118.m_log = &local_108;
      pTVar3 = (TestLog *)(plVar8 + 2);
      if ((TestLog *)*plVar8 == pTVar3) {
        local_108.m_log = pTVar3->m_log;
        lStack_100 = plVar8[3];
      }
      else {
        local_108.m_log = pTVar3->m_log;
        local_118.m_log = (TestLog *)*plVar8;
      }
      local_110 = plVar8[1];
      *plVar8 = (long)pTVar3;
      plVar8[1] = 0;
      *(undefined1 *)&pTVar3->m_log = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
      psVar9 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_b8.field_2._M_allocated_capacity = *psVar9;
        local_b8.field_2._8_8_ = plVar8[3];
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      }
      else {
        local_b8.field_2._M_allocated_capacity = *psVar9;
        local_b8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_b8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_b8);
      psVar9 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_98.field_2._M_allocated_capacity = *psVar9;
        local_98.field_2._8_8_ = plVar8[3];
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar9;
        local_98._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_98._M_string_length = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      tcu::ResultCollector::fail(local_78,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if (local_118.m_log != &local_108) {
        operator_delete(local_118.m_log,(ulong)((long)&(local_108.m_log)->flags + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (local_d8 != local_c8) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (local_78,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               0x8a49,(this->super_TextureTest).m_type);
  }
  bVar4 = isPureUintTester((this->super_TextureTest).m_tester);
  if (!bVar4) goto LAB_00943740;
  local_68.m_log._0_4_ = 0x8a4a;
  local_6c = 0x8a49;
  glu::CallLogWrapper::glTexParameterIuiv
            (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
             (GLuint *)&local_68);
  GVar7 = glu::CallLogWrapper::glGetError(gl);
  if (GVar7 != 0) {
    local_d8 = local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Got Error ","");
    local_60 = glu::getErrorName;
    local_58 = GVar7;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_f8,&local_60);
    uVar10 = 0xf;
    if (local_d8 != local_c8) {
      uVar10 = local_c8[0];
    }
    if (uVar10 < local_f8._M_string_length + local_d0) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        uVar11 = local_f8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_f8._M_string_length + local_d0) goto LAB_009432ec;
      plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_d8)
      ;
    }
    else {
LAB_009432ec:
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_d8,(ulong)local_f8._M_dataplus._M_p);
    }
    local_118.m_log = &local_108;
    pTVar3 = (TestLog *)(plVar8 + 2);
    if ((TestLog *)*plVar8 == pTVar3) {
      local_108.m_log = pTVar3->m_log;
      lStack_100 = plVar8[3];
    }
    else {
      local_108.m_log = pTVar3->m_log;
      local_118.m_log = (TestLog *)*plVar8;
    }
    local_110 = plVar8[1];
    *plVar8 = (long)pTVar3;
    plVar8[1] = 0;
    *(undefined1 *)&pTVar3->m_log = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_b8.field_2._M_allocated_capacity = *psVar9;
      local_b8.field_2._8_8_ = plVar8[3];
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *psVar9;
      local_b8._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_b8._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_b8);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_98.field_2._M_allocated_capacity = *psVar9;
      local_98.field_2._8_8_ = plVar8[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar9;
      local_98._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_98._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::ResultCollector::fail(local_78,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (local_118.m_log != &local_108) {
      operator_delete(local_118.m_log,(ulong)((long)&(local_108.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_d8 != local_c8) {
      operator_delete(local_d8,local_c8[0] + 1);
    }
  }
  StateQueryUtil::verifyStateTextureParamInteger
            (local_78,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a4a
             ,(this->super_TextureTest).m_type);
  glu::CallLogWrapper::glTexParameterIuiv
            (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,&local_6c);
  GVar7 = glu::CallLogWrapper::glGetError(gl);
  if (GVar7 != 0) {
    local_d8 = local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Got Error ","");
    local_60 = glu::getErrorName;
    local_58 = GVar7;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_f8,&local_60);
    uVar10 = 0xf;
    if (local_d8 != local_c8) {
      uVar10 = local_c8[0];
    }
    if (uVar10 < local_f8._M_string_length + local_d0) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        uVar11 = local_f8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_f8._M_string_length + local_d0) goto LAB_0094356c;
      plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_d8)
      ;
    }
    else {
LAB_0094356c:
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_d8,(ulong)local_f8._M_dataplus._M_p);
    }
    local_118.m_log = &local_108;
    pTVar3 = (TestLog *)(plVar8 + 2);
    if ((TestLog *)*plVar8 == pTVar3) {
      local_108.m_log = pTVar3->m_log;
      lStack_100 = plVar8[3];
    }
    else {
      local_108.m_log = pTVar3->m_log;
      local_118.m_log = (TestLog *)*plVar8;
    }
    local_110 = plVar8[1];
    *plVar8 = (long)pTVar3;
    plVar8[1] = 0;
    *(undefined1 *)&pTVar3->m_log = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_b8.field_2._M_allocated_capacity = *psVar9;
      local_b8.field_2._8_8_ = plVar8[3];
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *psVar9;
      local_b8._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_b8._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_b8);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_98.field_2._M_allocated_capacity = *psVar9;
      local_98.field_2._8_8_ = plVar8[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar9;
      local_98._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_98._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::ResultCollector::fail(local_78,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (local_118.m_log != &local_108) {
      operator_delete(local_118.m_log,(ulong)((long)&(local_108.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_d8 != local_c8) {
      operator_delete(local_d8,local_c8[0] + 1);
    }
  }
  StateQueryUtil::verifyStateTextureParamInteger
            (local_78,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a49
             ,(this->super_TextureTest).m_type);
LAB_00943740:
  glu::ObjectWrapper::~ObjectWrapper(&local_48);
  return;
}

Assistant:

void TextureSRGBDecodeCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	const bool		isPureCase	= isPureIntTester(m_tester) || isPureUintTester(m_tester);
	glu::Texture	texture		(m_renderCtx);

	gl.glBindTexture(m_target, *texture);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "bind");

	if (!isPureCase)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);
	}

	if (!isPureCase)
	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Toggle", "Toggle");
		const glw::GLint			decodeInt		= GL_DECODE_EXT;
		const glw::GLfloat			decodeFloat		= (glw::GLfloat)GL_DECODE_EXT;

		gl.glTexParameteri(m_target, m_pname, GL_SKIP_DECODE_EXT);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_SKIP_DECODE_EXT, m_type);

		gl.glTexParameteriv(m_target, m_pname, &decodeInt);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);

		gl.glTexParameterf(m_target, m_pname, GL_SKIP_DECODE_EXT);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_SKIP_DECODE_EXT, m_type);

		gl.glTexParameterfv(m_target, m_pname, &decodeFloat);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);
	}

	if (isPureIntTester(m_tester))
	{
		const glw::GLint skipDecode	= GL_SKIP_DECODE_EXT;
		const glw::GLint decode		= GL_DECODE_EXT;

		gl.glTexParameterIiv(m_target, m_pname, &skipDecode);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIiv");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_SKIP_DECODE_EXT, m_type);

		gl.glTexParameterIiv(m_target, m_pname, &decode);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIiv");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);
	}

	if (isPureUintTester(m_tester))
	{
		const glw::GLuint skipDecode	= GL_SKIP_DECODE_EXT;
		const glw::GLuint decode		= GL_DECODE_EXT;

		gl.glTexParameterIuiv(m_target, m_pname, &skipDecode);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIuiv");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_SKIP_DECODE_EXT, m_type);

		gl.glTexParameterIuiv(m_target, m_pname, &decode);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIuiv");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);
	}
}